

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# WeakReferenceDictionary.h
# Opt level: O1

void __thiscall
JsUtil::
SplitWeakDictionary<int,_Js::JavascriptSymbol_*,_false,_DictionarySizePolicy<PrimePolicy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::NoResizeLock,_Memory::Recycler>
::Resize(SplitWeakDictionary<int,_Js::JavascriptSymbol_*,_false,_DictionarySizePolicy<PrimePolicy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::NoResizeLock,_Memory::Recycler>
         *this)

{
  int *piVar1;
  code *pcVar2;
  uint size;
  ValueEntryData<int> VVar3;
  Type TVar4;
  int *piVar5;
  WeakType *address;
  bool bVar6;
  uint uVar7;
  hash_t hVar8;
  EntryType *pEVar9;
  RecyclerWeakReferenceRegionItem<Js::JavascriptSymbol_*> *pRVar10;
  undefined4 *puVar11;
  ValueEntry<int,_JsUtil::(anonymous_namespace)::ValueEntryData<int>_> *pVVar12;
  int iVar13;
  bool zeroAllocate;
  long lVar14;
  size_t count;
  ulong uVar15;
  Type local_58;
  int *newBuckets;
  EntryType *newEntries;
  WeakType *newWeakRefs;
  int local_38;
  uint local_34;
  int modIndex;
  
  size = this->count * 2;
  local_38 = 0x4b;
  uVar7 = 4;
  if (8 < size) {
    uVar7 = this->count & 0x7fffffff;
  }
  uVar7 = PrimePolicy::GetPrime(uVar7,&local_38);
  local_58.ptr = (int *)0x0;
  newBuckets = (int *)0x0;
  newEntries = (EntryType *)0x0;
  local_34 = size;
  if (uVar7 == this->bucketCount) {
    pEVar9 = AllocateEntries(this,size,zeroAllocate);
    count = (size_t)(int)size;
    newBuckets = (int *)pEVar9;
    pRVar10 = Memory::Recycler::CreateWeakReferenceRegion<Js::JavascriptSymbol*>(this->alloc,count);
    newWeakRefs = (WeakType *)&this->entries;
    newEntries = (EntryType *)pRVar10;
    js_memcpy_s(pEVar9,count * 8,(this->entries).ptr,(long)this->count << 3);
    if ((g_verifyIsNotBarrierAddress != (code *)0x0 & DAT_015d641c) == 1) {
      (*g_verifyIsNotBarrierAddress)(pEVar9,count);
    }
    Memory::
    CopyArray<Memory::RecyclerWeakReferenceRegionItem<Js::JavascriptSymbol*>,Memory::RecyclerWeakReferenceRegionItem<Js::JavascriptSymbol*>,Memory::Recycler>
              (pRVar10,count,(this->weakRefs).ptr,(long)this->count);
    address = newWeakRefs;
    Memory::Recycler::WBSetBit((char *)newWeakRefs);
    (this->entries).ptr = pEVar9;
    Memory::RecyclerWriteBarrierManager::WriteBarrier(address);
    Memory::Recycler::WBSetBit((char *)&this->weakRefs);
    (this->weakRefs).ptr = pRVar10;
    Memory::RecyclerWriteBarrierManager::WriteBarrier(&this->weakRefs);
    this->size = local_34;
    this->modFunctionIndex = local_38;
  }
  else {
    newWeakRefs = (WeakType *)CONCAT44(newWeakRefs._4_4_,uVar7);
    Allocate(this,&local_58.ptr,(EntryType **)&newBuckets,(WeakType **)&newEntries,uVar7,size);
    pEVar9 = newEntries;
    piVar5 = newBuckets;
    TVar4.ptr = local_58.ptr;
    this->modFunctionIndex = local_38;
    this->count = 0;
    if (this->bucketCount != 0) {
      puVar11 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      uVar15 = 0;
      do {
        piVar1 = (this->buckets).ptr;
        if (-1 < piVar1[uVar15]) {
          for (iVar13 = piVar1[uVar15]; iVar13 != -1;
              iVar13 = pVVar12[iVar13].super_ValueEntryData<int>.next) {
            pVVar12 = (this->entries).ptr;
            if (pVVar12[iVar13].super_ValueEntryData<int>.next < -1) {
              AssertCount = AssertCount + 1;
              Js::Throw::LogAssert();
              *puVar11 = 1;
              bVar6 = Js::Throw::ReportAssert
                                ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/DataStructures/WeakReferenceDictionary.h"
                                 ,0x245,"(false)",
                                 "Following bucket chains should not result in free entries");
              if (!bVar6) {
                pcVar2 = (code *)invalidInstructionException();
                (*pcVar2)();
              }
              *puVar11 = 0;
              break;
            }
            if ((this->weakRefs).ptr[iVar13].ptr != (Type)0x0) {
              hVar8 = PrimePolicy::ModPrime
                                (pVVar12[iVar13].super_ValueEntryData<int>.value & 0x7fffffff,
                                 (uint)newWeakRefs,this->modFunctionIndex);
              lVar14 = (long)this->count;
              piVar5[lVar14 * 2 + 1] = TVar4.ptr[(int)hVar8];
              piVar5[lVar14 * 2] = (this->entries).ptr[iVar13].super_ValueEntryData<int>.value;
              pRVar10 = (this->weakRefs).ptr + iVar13;
              VVar3 = (ValueEntryData<int>)pRVar10->heapBlock;
              pEVar9[lVar14 * 2].super_ValueEntryData<int> = (ValueEntryData<int>)pRVar10->ptr;
              (&pEVar9[lVar14 * 2].super_ValueEntryData<int>)[1] = VVar3;
              TVar4.ptr[(int)hVar8] = this->count;
              this->count = this->count + 1;
              pVVar12 = (this->entries).ptr;
            }
          }
        }
        uVar15 = uVar15 + 1;
      } while (uVar15 < this->bucketCount);
    }
    TVar4.ptr = local_58.ptr;
    this->freeList = 0;
    this->freeCount = 0;
    Memory::Recycler::WBSetBit((char *)&this->buckets);
    (this->buckets).ptr = TVar4.ptr;
    Memory::RecyclerWriteBarrierManager::WriteBarrier(&this->buckets);
    piVar5 = newBuckets;
    Memory::Recycler::WBSetBit((char *)&this->entries);
    (this->entries).ptr =
         (ValueEntry<int,_JsUtil::(anonymous_namespace)::ValueEntryData<int>_> *)piVar5;
    Memory::RecyclerWriteBarrierManager::WriteBarrier(&this->entries);
    pEVar9 = newEntries;
    Memory::Recycler::WBSetBit((char *)&this->weakRefs);
    (this->weakRefs).ptr = (RecyclerWeakReferenceRegionItem<Js::JavascriptSymbol_*> *)pEVar9;
    Memory::RecyclerWriteBarrierManager::WriteBarrier(&this->weakRefs);
    this->bucketCount = (uint)newWeakRefs;
    this->size = local_34;
  }
  return;
}

Assistant:

void Resize()
        {
            AutoDoResize autoDoResize(*this);
            __analysis_assert(count > 1);

            int newSize = SizePolicy::GetNextSize(count);
            int modIndex = UNKNOWN_MOD_INDEX;
            uint newBucketCount = SizePolicy::GetBucketSize(newSize, &modIndex);

            __analysis_assume(newSize > count);
            int* newBuckets = nullptr;
            EntryType* newEntries = nullptr;
            WeakType* newWeakRefs = nullptr;
            if (newBucketCount == bucketCount)
            {
                // no need to rehash
                newEntries = AllocateEntries(newSize);
                newWeakRefs = AllocateWeakRefs(newSize);
                CopyArray<EntryType>(newEntries, newSize, entries, count);
                CopyArray<WeakType>(newWeakRefs, newSize, weakRefs, count); // TODO: concurrency issues?

                this->entries = newEntries;
                this->weakRefs = newWeakRefs;
                this->size = newSize;
                this->modFunctionIndex = modIndex;
                return;
            }

            Allocate(&newBuckets, &newEntries, &newWeakRefs, newBucketCount, newSize);

            this->modFunctionIndex = modIndex;

            // Need to re-bucket the entries
            // Also need to account for whether the weak refs have been collected
            // Have to go in order so we can remove entries as appropriate
            this->count = 0;
            for (uint i = 0; i < this->bucketCount; ++i)
            {
                if (this->buckets[i] < 0)
                {
                    continue;
                }

                for (int currentEntry = this->buckets[i]; currentEntry != -1; )
                {
                    if (IsFreeEntry(entries[currentEntry]))
                    {
                        // Entry is free; this shouldn't happen, but stop following the chain
                        AssertMsg(false, "Following bucket chains should not result in free entries");
                        break;
                    }
                    if (this->weakRefs[currentEntry] == nullptr)
                    {
                        // The weak ref has been collected; don't bother bringing it to the new collection
                        currentEntry = this->entries[currentEntry].next;
                        continue;
                    }

                    hash_t hashCode = GetHashCodeWithKey<TBKey>(this->GetKey(currentEntry));
                    int bucket = GetBucket(hashCode, newBucketCount, modFunctionIndex);
                    newEntries[count].next = newBuckets[bucket];
                    newEntries[count].SetValue(this->entries[currentEntry].Value());
                    newWeakRefs[count] = this->weakRefs[currentEntry];
                    newBuckets[bucket] = count;
                    ++count;

                    currentEntry = this->entries[currentEntry].next;
                }
            }
            this->freeCount = 0;
            this->freeList = 0;
            this->buckets = newBuckets;
            this->entries = newEntries;
            this->weakRefs = newWeakRefs;
            this->bucketCount = newBucketCount;
            this->size = newSize;

        }